

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,st_ptls_traffic_protection_t *enc)

{
  uint8_t type_00;
  size_t sVar1;
  ulong __size;
  size_t sVar2;
  uint8_t *src;
  size_t encrypted_len;
  size_t overhead;
  int ret;
  uint8_t type;
  uint8_t *tmpbuf;
  size_t bodylen;
  st_ptls_traffic_protection_t *enc_local;
  size_t rec_start_local;
  ptls_buffer_t *buf_local;
  
  sVar1 = buf->off - rec_start;
  __size = sVar1 - 5;
  type_00 = buf->base[rec_start];
  if (((enc->field_0x58 & 1) == 0) && (__size < 0x4001)) {
    sVar1 = enc->aead->algo->tag_size + 1;
    buf_local._4_4_ = ptls_buffer_reserve_aligned(buf,sVar1,enc->aead->algo->align_bits);
    if (buf_local._4_4_ == 0) {
      sVar2 = aead_encrypt(enc,buf->base + rec_start + 5,buf->base + rec_start + 5,__size,type_00);
      if (sVar2 != __size + sVar1) {
        __assert_fail("encrypted_len == bodylen + overhead",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x336,
                      "int buffer_encrypt_record(ptls_buffer_t *, size_t, struct st_ptls_traffic_protection_t *)"
                     );
      }
      buf->off = sVar1 + buf->off;
      buf->base[rec_start] = '\x17';
      buf->base[rec_start + 3] = (uint8_t)(sVar2 >> 8);
      buf->base[rec_start + 4] = (uint8_t)sVar2;
      buf_local._4_4_ = 0;
    }
  }
  else {
    src = (uint8_t *)malloc(__size);
    if (src == (uint8_t *)0x0) {
      overhead._0_4_ = 0x201;
      buf_local._4_4_ = (int)overhead;
    }
    else {
      memcpy(src,buf->base + rec_start + 5,__size);
      (*ptls_clear_memory)(buf->base + rec_start,sVar1);
      buf->off = rec_start;
      buf_local._4_4_ = buffer_push_encrypted_records(buf,type_00,src,__size,enc);
      (*ptls_clear_memory)(src,__size);
      free(src);
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, struct st_ptls_traffic_protection_t *enc)
{
    size_t bodylen = buf->off - rec_start - 5;
    uint8_t *tmpbuf, type = buf->base[rec_start];
    int ret;

    /* Fast path: do in-place encryption if only one record needs to be emitted. (For simplicity, do not take this path if TLS 1.2
     * is used, as this function will be called no more than once per connection, for encrypting an alert.) */
    if (!enc->tls12 && bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE) {
        size_t overhead = 1 + enc->aead->algo->tag_size;
        if ((ret = ptls_buffer_reserve_aligned(buf, overhead, enc->aead->algo->align_bits)) != 0)
            return ret;
        size_t encrypted_len = aead_encrypt(enc, buf->base + rec_start + 5, buf->base + rec_start + 5, bodylen, type);
        assert(encrypted_len == bodylen + overhead);
        buf->off += overhead;
        buf->base[rec_start] = PTLS_CONTENT_TYPE_APPDATA;
        buf->base[rec_start + 3] = (encrypted_len >> 8) & 0xff;
        buf->base[rec_start + 4] = encrypted_len & 0xff;
        return 0;
    }

    /* move plaintext to temporary buffer */
    if ((tmpbuf = malloc(bodylen)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(tmpbuf, buf->base + rec_start + 5, bodylen);
    ptls_clear_memory(buf->base + rec_start, bodylen + 5);
    buf->off = rec_start;

    /* push encrypted records */
    ret = buffer_push_encrypted_records(buf, type, tmpbuf, bodylen, enc);

Exit:
    if (tmpbuf != NULL) {
        ptls_clear_memory(tmpbuf, bodylen);
        free(tmpbuf);
    }
    return ret;
}